

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

int __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler3>_>::
ReadUInt(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
         *this,uint ub)

{
  uint in_ESI;
  TextReader<fmt::Locale> *in_RDI;
  CStringRef unaff_retaddr;
  uint unsigned_value;
  int value;
  BasicCStringRef<char> local_20;
  uint local_14;
  uint uVar1;
  
  local_14 = TextReader<fmt::Locale>::ReadUInt((TextReader<fmt::Locale> *)0x247f2f);
  uVar1 = local_14;
  if (in_ESI <= local_14) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_20,"integer {} out of bounds");
    TextReader<fmt::Locale>::ReportError<int>(in_RDI,unaff_retaddr,(int *)CONCAT44(in_ESI,uVar1));
  }
  return uVar1;
}

Assistant:

int ReadUInt(unsigned ub) {
    int value = reader_.ReadUInt();
    unsigned unsigned_value = value;
    if (unsigned_value >= ub)
      reader_.ReportError("integer {} out of bounds", value);
    return value;
  }